

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::pipeline::anon_unknown_1::ImageViewTest::createInstance(ImageViewTest *this,Context *context)

{
  uint uVar1;
  ImageSamplingInstance *this_00;
  int layerCount;
  UVec2 renderSize;
  IVec3 imageSize;
  undefined1 local_90 [40];
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined4 local_50;
  float local_4c;
  VkBorderColor local_48;
  VkBool32 local_44;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> vertices;
  
  uVar1 = (uint)(VK_IMAGE_VIEW_TYPE_2D < this->m_imageViewType);
  renderSize.m_data[0] = uVar1 << 5 | 0x10;
  renderSize.m_data[1] = uVar1 * 0x10 + 0x10;
  getImageSize((ImageViewTest *)&imageSize,this->m_imageViewType);
  uVar1 = this->m_imageViewType - VK_IMAGE_VIEW_TYPE_3D;
  if (uVar1 < 5) {
    layerCount = *(int *)(&DAT_00958728 + (ulong)uVar1 * 4);
  }
  else {
    layerCount = 6;
  }
  createTestQuadMosaic(&vertices,this->m_imageViewType);
  local_90._0_4_ = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  local_90._8_8_ = (void *)0x0;
  local_90._16_8_ = 0;
  local_90._24_8_ = 0;
  local_90._32_8_ = &DAT_200000002;
  uStack_68 = 2;
  local_60 = 0x3f80000000000000;
  uStack_58 = 0;
  local_50 = 0;
  local_4c = (float)((this->m_subresourceRange).levelCount - 1);
  local_48 = getFormatBorderColor(BORDER_COLOR_TRANSPARENT_BLACK,this->m_imageFormat);
  local_44 = 0;
  this_00 = (ImageSamplingInstance *)operator_new(0x348);
  ImageSamplingInstance::ImageSamplingInstance
            (this_00,context,&renderSize,this->m_imageViewType,this->m_imageFormat,&imageSize,
             layerCount,&this->m_componentMapping,&this->m_subresourceRange,
             (VkSamplerCreateInfo *)local_90,this->m_samplerLod,&vertices,
             VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
  std::_Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
  ~_Vector_base(&vertices.
                 super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
               );
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* ImageViewTest::createInstance (Context& context) const
{
	const tcu::UVec2				renderSize		= getRenderSize(m_imageViewType);
	const tcu::IVec3				imageSize		= getImageSize(m_imageViewType);
	const int						arraySize		= getArraySize(m_imageViewType);
	const std::vector<Vertex4Tex4>	vertices		= createTestQuadMosaic(m_imageViewType);

	const VkSamplerCreateInfo		samplerParams	=
	{
		VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,									// VkStructureType			sType;
		DE_NULL,																// const void*				pNext;
		0u,																		// VkSamplerCreateFlags		flags;
		VK_FILTER_NEAREST,														// VkFilter					magFilter;
		VK_FILTER_NEAREST,														// VkFilter					minFilter;
		VK_SAMPLER_MIPMAP_MODE_NEAREST,											// VkSamplerMipmapMode		mipmapMode;
		VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,									// VkSamplerAddressMode		addressModeU;
		VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,									// VkSamplerAddressMode		addressModeV;
		VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,									// VkSamplerAddressMode		addressModeW;
		0.0f,																	// float					mipLodBias;
		VK_FALSE,																// VkBool32					anisotropyEnable;
		1.0f,																	// float					maxAnisotropy;
		false,																	// VkBool32					compareEnable;
		VK_COMPARE_OP_NEVER,													// VkCompareOp				compareOp;
		0.0f,																	// float					minLod;
		(float)(m_subresourceRange.levelCount - 1),								// float					maxLod;
		getFormatBorderColor(BORDER_COLOR_TRANSPARENT_BLACK, m_imageFormat),	// VkBorderColor			borderColor;
		false																	// VkBool32					unnormalizedCoordinates;
	};

	return new ImageSamplingInstance(context, renderSize, m_imageViewType, m_imageFormat, imageSize, arraySize, m_componentMapping, m_subresourceRange, samplerParams, m_samplerLod, vertices);
}